

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::may_read_undefined_variable_in_block
          (Compiler *this,SPIRBlock *block,uint32_t var)

{
  uint uVar1;
  Instruction *pIVar2;
  uint32_t *puVar3;
  uint local_60;
  uint32_t i_1;
  uint32_t count_1;
  uint32_t i;
  uint32_t count;
  uint32_t *ops;
  Instruction *op;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  uint32_t var_local;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::Instruction>::begin
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  pIVar2 = VectorView<spirv_cross::Instruction>::end
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  do {
    if (__end1 == pIVar2) {
      return true;
    }
    puVar3 = stream(this,__end1);
    uVar1 = (uint)__end1->op;
    if (uVar1 == 0x39) {
      if (2 < __end1->length) {
        for (local_60 = 0; local_60 < __end1->length - 3; local_60 = local_60 + 1) {
          if (puVar3[local_60 + 3] == var) {
            return true;
          }
        }
      }
    }
    else if (uVar1 == 0x3d) {
LAB_00598dae:
      if (puVar3[2] == var) {
        return true;
      }
    }
    else if (uVar1 - 0x3e < 2) {
      if (*puVar3 == var) {
        return false;
      }
    }
    else if (uVar1 - 0x41 < 3) {
      if (puVar3[2] == var) {
        return true;
      }
    }
    else {
      if (uVar1 == 0x53) goto LAB_00598dae;
      if (uVar1 == 0xa9) {
        if ((puVar3[3] == var) || (puVar3[4] == var)) {
          return true;
        }
      }
      else if ((uVar1 == 0xf5) && (1 < __end1->length)) {
        for (i_1 = 0; i_1 < __end1->length - 2; i_1 = i_1 + 2) {
          if (puVar3[i_1 + 2] == var) {
            return true;
          }
        }
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool Compiler::may_read_undefined_variable_in_block(const SPIRBlock &block, uint32_t var)
{
	for (auto &op : block.ops)
	{
		auto *ops = stream(op);
		switch (op.op)
		{
		case OpStore:
		case OpCopyMemory:
			if (ops[0] == var)
				return false;
			break;

		case OpAccessChain:
		case OpInBoundsAccessChain:
		case OpPtrAccessChain:
			// Access chains are generally used to partially read and write. It's too hard to analyze
			// if all constituents are written fully before continuing, so just assume it's preserved.
			// This is the same as the parameter preservation analysis.
			if (ops[2] == var)
				return true;
			break;

		case OpSelect:
			// Variable pointers.
			// We might read before writing.
			if (ops[3] == var || ops[4] == var)
				return true;
			break;

		case OpPhi:
		{
			// Variable pointers.
			// We might read before writing.
			if (op.length < 2)
				break;

			uint32_t count = op.length - 2;
			for (uint32_t i = 0; i < count; i += 2)
				if (ops[i + 2] == var)
					return true;
			break;
		}

		case OpCopyObject:
		case OpLoad:
			if (ops[2] == var)
				return true;
			break;

		case OpFunctionCall:
		{
			if (op.length < 3)
				break;

			// May read before writing.
			uint32_t count = op.length - 3;
			for (uint32_t i = 0; i < count; i++)
				if (ops[i + 3] == var)
					return true;
			break;
		}

		default:
			break;
		}
	}

	// Not accessed somehow, at least not in a usual fashion.
	// It's likely accessed in a branch, so assume we must preserve.
	return true;
}